

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

void Bmc_ComputeSimTest(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *vPat2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  ulong uVar5;
  undefined1 *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  bool bVar18;
  int DiffCount [64];
  int PatCount [64] [2] [2];
  int Count [2] [64] [64];
  undefined1 *local_8548;
  uint local_8538 [64];
  uint local_8438 [256];
  undefined1 local_8038 [32776];
  
  local_8548 = local_8038;
  piVar2 = (int *)0x0;
  memset(local_8548,0,0x8000);
  puVar17 = local_8438;
  memset(puVar17,0,0x400);
  memset(local_8538,0,0x100);
  iVar16 = p->vCis->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar15 = iVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar15;
  if (iVar15 != 0) {
    piVar2 = (int *)malloc((long)iVar15 * 4);
  }
  p_00->pArray = piVar2;
  vPat2 = (Vec_Int_t *)malloc(0x10);
  vPat2->nSize = 0;
  vPat2->nCap = iVar15;
  if (iVar15 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar15 << 2);
  }
  vPat2->pArray = piVar2;
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar4 = p->vSims->pArray;
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  iVar16 = p->nObjs;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar15 = iVar16;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar15;
  iVar7 = 0;
  if (iVar15 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar15 << 3);
  }
  pVVar3->pArray = pwVar4;
  pVVar3->nSize = iVar16;
  memset(pwVar4,0,(long)iVar16 << 3);
  p->vSims = pVVar3;
  printf("Number of patterns = %d.\n",0x100);
  do {
    p_00->nSize = 0;
    if (0 < p->vCis->nSize) {
      iVar16 = 0;
      do {
        uVar1 = rand();
        Vec_IntPush(p_00,uVar1 & 1);
        iVar16 = iVar16 + 1;
      } while (iVar16 < p->vCis->nSize);
    }
    uVar1 = Bmc_ComputeSimDiff(p,p_00,vPat2);
    iVar16 = p_00->nSize;
    if (0 < (long)iVar16) {
      piVar2 = p_00->pArray;
      lVar9 = 0;
      do {
        local_8438[(ulong)uVar1 * 2 + *(int *)((long)piVar2 + lVar9) + lVar9] =
             local_8438[(ulong)uVar1 * 2 + *(int *)((long)piVar2 + lVar9) + lVar9] + 1;
        lVar9 = lVar9 + 4;
      } while ((long)iVar16 * 4 != lVar9);
    }
    uVar5 = (ulong)vPat2->nSize;
    if (0 < (long)uVar5) {
      piVar2 = vPat2->pArray;
      puVar6 = local_8038 + (ulong)uVar1 * 0x4000;
      uVar11 = 0;
      uVar8 = uVar5;
      piVar10 = piVar2;
      do {
        iVar16 = piVar2[uVar11];
        if (iVar16 != 0) {
          local_8538[uVar11] = local_8538[uVar11] + 1;
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < uVar5) {
          uVar12 = 1;
          do {
            if ((iVar16 != 0) && (piVar10[uVar12] != 0)) {
              *(int *)(puVar6 + uVar12 * 4) = *(int *)(puVar6 + uVar12 * 4) + 1;
            }
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
        piVar10 = piVar10 + 1;
        puVar6 = puVar6 + 0x104;
        uVar8 = uVar8 - 1;
      } while (uVar11 != uVar5);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x100);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vPat2->pArray != (int *)0x0) {
    free(vPat2->pArray);
    vPat2->pArray = (int *)0x0;
  }
  free(vPat2);
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar4 = p->vSims->pArray;
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  putchar(10);
  printf("      ");
  if (0 < p->vCis->nSize) {
    iVar16 = 0;
    do {
      printf("%3c ",(ulong)(iVar16 + 0x61));
      iVar16 = iVar16 + 1;
    } while (iVar16 < p->vCis->nSize);
  }
  putchar(10);
  printf("Off0  ");
  if (0 < p->vCis->nSize) {
    lVar9 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar9 = lVar9 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar9 < p->vCis->nSize);
  }
  putchar(10);
  printf("Off1  ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 1;
    lVar9 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar9 = lVar9 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar9 < p->vCis->nSize);
  }
  putchar(10);
  printf("On0   ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 2;
    lVar9 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar9 = lVar9 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar9 < p->vCis->nSize);
  }
  putchar(10);
  printf("On1   ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 3;
    lVar9 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar9 = lVar9 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar9 < p->vCis->nSize);
  }
  putchar(10);
  putchar(10);
  printf("Diff  ");
  if (0 < p->vCis->nSize) {
    lVar9 = 0;
    do {
      printf("%3d ",(ulong)local_8538[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->vCis->nSize);
  }
  putchar(10);
  putchar(10);
  lVar9 = 0;
  do {
    printf("      ");
    if (0 < p->vCis->nSize) {
      iVar16 = 0;
      do {
        printf("%3c ",(ulong)(iVar16 + 0x61));
        iVar16 = iVar16 + 1;
      } while (iVar16 < p->vCis->nSize);
    }
    putchar(10);
    if (0 < p->vCis->nSize) {
      lVar13 = 0;
      puVar6 = local_8548;
      do {
        printf(" %c    ",(ulong)((int)lVar13 + 0x61));
        if (0 < p->vCis->nSize) {
          lVar14 = 0;
          do {
            if (*(int *)(puVar6 + lVar14 * 4) == 0) {
              printf("  . ");
            }
            else {
              printf("%3d ");
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < p->vCis->nSize);
        }
        putchar(10);
        lVar13 = lVar13 + 1;
        puVar6 = puVar6 + 0x100;
      } while (lVar13 < p->vCis->nSize);
    }
    putchar(10);
    local_8548 = local_8548 + 0x4000;
    bVar18 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar18);
  return;
}

Assistant:

void Bmc_ComputeSimTest( Gia_Man_t * p )
{
    int i, v, w, Res, Bit, Bit2, nPats = 256;
    int Count[2][64][64] = {{{0}}};
    int PatCount[64][2][2] = {{{0}}};
    int DiffCount[64] = {0};
    Vec_Int_t * vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_Int_t * vPat2 = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) );
    printf( "Number of patterns = %d.\n", nPats );
    for ( i = 0; i < nPats; i++ )
    {
        Vec_IntClear( vPat );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            Vec_IntPush( vPat, rand() & 1 );

//        Vec_IntForEachEntry( vPat, Bit, v )
//            printf( "%d", Bit );
//        printf( "    " );

        Res = Bmc_ComputeSimDiff( p, vPat, vPat2 );
//        printf( "%d ", Res );

//        Vec_IntForEachEntry( vPat2, Bit, v )
//            printf( "%d", Bit );
//        printf( "\n" );

        Vec_IntForEachEntry( vPat, Bit, v )
            PatCount[v][Res][Bit]++;

        Vec_IntForEachEntry( vPat2, Bit, v )
        {
            if ( Bit )
                DiffCount[v]++;
            Vec_IntForEachEntryStart( vPat2, Bit2, w, v + 1 )
                if ( Bit && Bit2 )
                    Count[Res][v][w]++;
        }
    }
    Vec_IntFree( vPat );
    Vec_IntFree( vPat2 );
    Vec_WrdFreeP( &p->vSims );


    printf( "\n" );
    printf( "      " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3c ", 'a'+v );
    printf( "\n" );

    printf( "Off0  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][0] );
    printf( "\n" );

    printf( "Off1  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][1] );
    printf( "\n" );

    printf( "On0   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][0] );
    printf( "\n" );

    printf( "On1   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][1] );
    printf( "\n" );
    printf( "\n" );

    printf( "Diff  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", DiffCount[v] );
    printf( "\n" );
    printf( "\n" );

    for ( i = 0; i < 2; i++ )
    {
        printf( "      " );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            printf( "%3c ", 'a'+v );
        printf( "\n" );

        for ( v = 0; v < Gia_ManCiNum(p); v++ )
        {
            printf( " %c    ", 'a'+v );
            for ( w = 0; w < Gia_ManCiNum(p); w++ )
            {
                if ( Count[i][v][w] )
                    printf( "%3d ", Count[i][v][w] );
                else
                    printf( "  . " );
            }
            printf( "\n" );
        }
        printf( "\n" );
    }
}